

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::crate::CrateReader::ReadPathListOp(CrateReader *this,ListOp<tinyusdz::Path> *d)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_260 [8];
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> items_5;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> items_4;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> items_3;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> items_2;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> items_1;
  undefined1 local_1e0 [8];
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> items;
  anon_class_8_1_8991fb9c ReadFn;
  ostringstream local_1a0 [8];
  ostringstream ss_e;
  ListOpHeader local_21;
  ListOp<tinyusdz::Path> *pLStack_20;
  ListOpHeader h;
  ListOp<tinyusdz::Path> *d_local;
  CrateReader *this_local;
  
  pLStack_20 = d;
  ListOpHeader::ListOpHeader(&local_21);
  bVar1 = StreamReader::read1(this->_sr,&local_21.bits);
  if (bVar1) {
    bVar1 = ListOpHeader::IsExplicit(&local_21);
    if (bVar1) {
      ListOp<tinyusdz::Path>::ClearAndMakeExplicit(pLStack_20);
    }
    items.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)this;
    bVar1 = ListOpHeader::HasExplicitItems(&local_21);
    if (bVar1) {
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_1e0);
      bVar1 = ReadPathListOp::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)
                         &items.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_1e0);
      if (bVar1) {
        ListOp<tinyusdz::Path>::SetExplicitItems
                  (pLStack_20,(vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_1e0);
      }
      else {
        ::std::__cxx11::string::operator+=
                  ((string *)&this->_err,"Failed to read ListOp::ExplicitItems.\n");
        this_local._7_1_ = 0;
      }
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_1e0);
      if (!bVar1) goto LAB_00230acf;
    }
    bVar1 = ListOpHeader::HasAddedItems(&local_21);
    if (bVar1) {
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                 &items_2.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = ReadPathListOp::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)
                         &items.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &items_2.
                          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        ListOp<tinyusdz::Path>::SetAddedItems
                  (pLStack_20,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &items_2.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        ::std::__cxx11::string::operator+=
                  ((string *)&this->_err,"Failed to read ListOp::AddedItems.\n");
        this_local._7_1_ = 0;
      }
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                 &items_2.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) goto LAB_00230acf;
    }
    bVar1 = ListOpHeader::HasPrependedItems(&local_21);
    if (bVar1) {
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                 &items_3.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = ReadPathListOp::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)
                         &items.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &items_3.
                          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        ListOp<tinyusdz::Path>::SetPrependedItems
                  (pLStack_20,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &items_3.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        ::std::__cxx11::string::operator+=
                  ((string *)&this->_err,"Failed to read ListOp::PrependedItems.\n");
        this_local._7_1_ = 0;
      }
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                 &items_3.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) goto LAB_00230acf;
    }
    bVar1 = ListOpHeader::HasAppendedItems(&local_21);
    if (bVar1) {
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                 &items_4.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = ReadPathListOp::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)
                         &items.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &items_4.
                          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        ListOp<tinyusdz::Path>::SetAppendedItems
                  (pLStack_20,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &items_4.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        ::std::__cxx11::string::operator+=
                  ((string *)&this->_err,"Failed to read ListOp::AppendedItems.\n");
        this_local._7_1_ = 0;
      }
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                 &items_4.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) goto LAB_00230acf;
    }
    bVar1 = ListOpHeader::HasDeletedItems(&local_21);
    if (bVar1) {
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                 &items_5.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = ReadPathListOp::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)
                         &items.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &items_5.
                          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        ListOp<tinyusdz::Path>::SetDeletedItems
                  (pLStack_20,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &items_5.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        ::std::__cxx11::string::operator+=
                  ((string *)&this->_err,"Failed to read ListOp::DeletedItems.\n");
        this_local._7_1_ = 0;
      }
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                 &items_5.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) goto LAB_00230acf;
    }
    bVar1 = ListOpHeader::HasOrderedItems(&local_21);
    if (bVar1) {
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_260);
      bVar1 = ReadPathListOp::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)
                         &items.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_260);
      if (bVar1) {
        ListOp<tinyusdz::Path>::SetOrderedItems
                  (pLStack_20,(vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_260);
      }
      else {
        ::std::__cxx11::string::operator+=
                  ((string *)&this->_err,"Failed to read ListOp::OrderedItems.\n");
        this_local._7_1_ = 0;
      }
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_260);
      if (!bVar1) goto LAB_00230acf;
    }
    this_local._7_1_ = 1;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar2 = ::std::operator<<((ostream *)local_1a0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadPathListOp");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x576);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1a0,"Failed to read ListOpHeader.");
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)&ReadFn);
    ::std::__cxx11::string::~string((string *)&ReadFn);
    ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
    this_local._7_1_ = 0;
  }
LAB_00230acf:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::ReadPathListOp(ListOp<Path> *d) {
  // read ListOpHeader
  ListOpHeader h;
  if (!_sr->read1(&h.bits)) {
    PUSH_ERROR("Failed to read ListOpHeader.");
    return false;
  }

  if (h.IsExplicit()) {
    DCOUT("IsExplicit()");
    d->ClearAndMakeExplicit();
  }

  // array data is not compressed
  auto ReadFn = [this](std::vector<Path> &result) -> bool {
    uint64_t n{0};
    if (!_sr->read8(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
      return false;
    }

    if (n > _config.maxArrayElements) {
      _err += "Too many ListOp elements.\n";
      return false;
    }

    CHECK_MEMORY_USAGE(size_t(n) * sizeof(crate::Index));

    std::vector<crate::Index> ivalue(static_cast<size_t>(n));

    if (!_sr->read(size_t(n) * sizeof(crate::Index),
                   size_t(n) * sizeof(crate::Index),
                   reinterpret_cast<uint8_t *>(ivalue.data()))) {
      PUSH_ERROR("Failed to read ListOp data..");
      return false;
    }

    // reconstruct
    result.resize(static_cast<size_t>(n));
    for (size_t i = 0; i < n; i++) {
      if (auto pv = GetPath(ivalue[i])) {
        result[i] = pv.value();
      } else {
        PUSH_ERROR("Invalid Index for Path.");
        return false;
      }
    }

    return true;
  };

  if (h.HasExplicitItems()) {
    std::vector<Path> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::ExplicitItems.\n";
      return false;
    }

    d->SetExplicitItems(items);
  }

  if (h.HasAddedItems()) {
    std::vector<Path> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::AddedItems.\n";
      return false;
    }

    d->SetAddedItems(items);
  }

  if (h.HasPrependedItems()) {
    std::vector<Path> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::PrependedItems.\n";
      return false;
    }

    d->SetPrependedItems(items);
  }

  if (h.HasAppendedItems()) {
    std::vector<Path> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::AppendedItems.\n";
      return false;
    }

    d->SetAppendedItems(items);
  }

  if (h.HasDeletedItems()) {
    std::vector<Path> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::DeletedItems.\n";
      return false;
    }

    d->SetDeletedItems(items);
  }

  if (h.HasOrderedItems()) {
    std::vector<Path> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::OrderedItems.\n";
      return false;
    }

    d->SetOrderedItems(items);
  }

  return true;
}